

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVassoc_immediate_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat client_data_00;
  CManager in_RDX;
  CMFormat f;
  EVaction ret;
  EVassoc_immediate_action_request *request;
  EV_int_response response;
  FMStructDescList in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  client_data_00 =
       CMlookup_format((CManager_conflict)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  if (client_data_00 == (CMFormat)0x0) {
    client_data_00 =
         INT_CMregister_format
                   (in_RDX,(FMStructDescList)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  EVar1 = EVassoc_immediate_action
                    ((CManager_conflict)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (EVstone)((ulong)in_RDX >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     client_data_00);
  CMwrite((CMConnection)CONCAT44(EVar1,*(undefined4 *)&in_RDX->transports),(CMFormat)in_RDX,
          (void *)CONCAT44(EVar1,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

static void
REVassoc_immediate_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_immediate_action_request *request = (EVassoc_immediate_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVassoc_immediate_action(cm, request->stone, request->action_spec, NULL);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}